

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O3

void __thiscall
stateObservation::ZeroDelayObserver::pushInput(ZeroDelayObserver *this,InputVector *u_k)

{
  _Map_pointer ppMVar1;
  int iVar2;
  
  if ((this->super_ObserverBase).p_ < 1) {
    return;
  }
  iVar2 = (*(this->super_ObserverBase)._vptr_ObserverBase[0x1c])();
  if ((char)iVar2 == '\0') {
    __assert_fail("checkInputVector(u_k) && \"The size of the input vector is incorrect\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x6e,
                  "virtual void stateObservation::ZeroDelayObserver::pushInput(const ObserverBase::InputVector &)"
                 );
  }
  ppMVar1 = (this->u_).v_.
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (0 < (long)(((long)(this->u_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)(this->u_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                 ((long)(this->u_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this->u_).v_.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                ((((ulong)((long)ppMVar1 -
                          (long)(this->u_).v_.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                (ulong)(ppMVar1 == (_Map_pointer)0x0)) * 0x20)) {
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&(this->u_).v_,u_k);
    return;
  }
  if ((this->x_).super_DebugItem<bool,_stateObservation::DebugItemDefaultValue<bool,_true>,_true>.b_
      != false) {
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue(&this->u_,u_k,(this->x_).k_);
    return;
  }
  __assert_fail("x_.isSet() && \"Unable to initialize input without time index, the state vector has not been set.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                ,0x76,
                "virtual void stateObservation::ZeroDelayObserver::pushInput(const ObserverBase::InputVector &)"
               );
}

Assistant:

void ZeroDelayObserver::pushInput(const ObserverBase::InputVector & u_k)
{
  if(p_ > 0)
  {
    BOOST_ASSERT(checkInputVector(u_k) && "The size of the input vector is incorrect");

    if(u_.size() > 0)
    {
      u_.pushBack(u_k);
    }
    else
    {
      BOOST_ASSERT(x_.isSet() && "Unable to initialize input without time index, the state vector has not been set.");
      /// we need the input at the time of the state vector to predict the next one
      u_.setValue(u_k, x_.getTime());
    }
  }
}